

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall
OptionRecordInt::OptionRecordInt
          (OptionRecordInt *this,string *Xname,string *Xdescription,bool Xadvanced,
          HighsInt *Xvalue_pointer,HighsInt Xlower_bound,HighsInt Xdefault_value,
          HighsInt Xupper_bound)

{
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  string local_70 [23];
  undefined1 in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  HighsOptionType in_stack_ffffffffffffffbc;
  OptionRecord *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  std::__cxx11::string::string(local_70,in_RDX);
  OptionRecord::OptionRecord
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *in_RDI = &PTR__OptionRecordInt_0096db30;
  in_RDI[0xb] = in_R8;
  *(undefined4 *)(in_RDI + 0xc) = in_R9D;
  *(undefined4 *)((long)in_RDI + 100) = in_stack_00000008;
  *(undefined4 *)(in_RDI + 0xd) = in_stack_00000010;
  *(undefined4 *)in_RDI[0xb] = *(undefined4 *)((long)in_RDI + 100);
  return;
}

Assistant:

OptionRecordInt(std::string Xname, std::string Xdescription, bool Xadvanced,
                  HighsInt* Xvalue_pointer, HighsInt Xlower_bound,
                  HighsInt Xdefault_value, HighsInt Xupper_bound)
      : OptionRecord(HighsOptionType::kInt, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    lower_bound = Xlower_bound;
    default_value = Xdefault_value;
    upper_bound = Xupper_bound;
    *value = default_value;
  }